

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

int cmcmd::ExecuteLinkScript
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  cmUVProcessChainBuilder *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  cmUVProcessChainBuilder *this_00;
  Status *this_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view value;
  string command;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  cmUVProcessChain chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  cmUVProcessChainBuilder builder;
  ifstream fin;
  string local_308;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  undefined1 local_2c0 [64];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [2];
  undefined1 local_238 [16];
  _func_int *local_228 [2];
  byte abStack_218 [488];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x61) {
    bVar2 = false;
  }
  else {
    local_238._8_8_ = pbVar1[3]._M_dataplus._M_p;
    local_238._0_8_ = pbVar1[3]._M_string_length;
    bVar2 = false;
    __str._M_str = "--verbose=";
    __str._M_len = 10;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_238,0,10,__str);
    if (iVar4 == 0) {
      std::__cxx11::string::substr
                ((ulong)local_238,
                 (ulong)((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 3));
      value._M_str = (char *)local_238._0_8_;
      value._M_len = local_238._8_8_;
      bVar2 = cmValue::IsOff(value);
      if ((_func_int **)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_228[0] + 1));
      }
      bVar2 = !bVar2;
    }
  }
  std::ifstream::ifstream
            (local_238,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,_S_in);
  if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0) {
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    local_308._M_string_length = 0;
    local_308.field_2._M_local_buf[0] = '\0';
    iVar4 = 0;
    this = (cmUVProcessChainBuilder *)(local_2c0 + 0x28);
    args_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2c0 + 8);
    do {
      bVar3 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_238,&local_308,(bool *)0x0,0xffffffffffffffff);
      if (!bVar3) break;
      iVar4 = 0;
      lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_308,0x7dda8b,0);
      if (lVar6 != -1) {
        cmUVProcessChainBuilder::cmUVProcessChainBuilder(this);
        this_00 = cmUVProcessChainBuilder::SetExternalStream(this,Stream_OUTPUT,_stdout);
        cmUVProcessChainBuilder::SetExternalStream(this_00,Stream_ERROR,_stderr);
        local_2c0._8_4_ = None;
        local_2c0._12_4_ = 0;
        local_2c0._16_4_ = None;
        local_2c0._20_4_ = 0;
        local_2c0._24_8_ = (pointer)0x0;
        cmSystemTools::ParseUnixCommandLine(local_308._M_dataplus._M_p,args_00);
        cmUVProcessChainBuilder::AddCommand(this,args_00);
        if (bVar2) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                              local_308._M_string_length);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
        cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_2c0);
        cmUVProcessChain::Wait((cmUVProcessChain *)local_2c0,0);
        this_01 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_2c0,0);
        cmUVProcessChain::Status::GetException_abi_cxx11_(&local_2e8,this_01);
        if (local_2e8.first == None) {
          iVar4 = (int)this_01->ExitStatus;
        }
        else if (local_2e8.first == Spawn) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error running link command: ",0x1c);
          iVar4 = 2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_2e8.second._M_dataplus._M_p,
                     local_2e8.second._M_string_length);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error running link command: ",0x1c);
          iVar4 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_2e8.second._M_dataplus._M_p,
                     local_2e8.second._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8.second._M_dataplus._M_p != &local_2e8.second.field_2) {
          operator_delete(local_2e8.second._M_dataplus._M_p,
                          local_2e8.second.field_2._M_allocated_capacity + 1);
        }
        cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_2c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(args_00);
        if (local_268 != local_258) {
          operator_delete(local_268,local_258[0]._M_allocated_capacity + 1);
        }
        std::
        vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
        ::~vector(&local_280);
      }
    } while (iVar4 == 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,
                      CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                               local_308.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error opening link script \"",0x1b);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,pbVar1[2]._M_dataplus._M_p,pbVar1[2]._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    iVar4 = 1;
    std::ostream::flush();
  }
  std::ifstream::~ifstream(local_238);
  return iVar4;
}

Assistant:

int cmcmd::ExecuteLinkScript(std::vector<std::string> const& args)
{
  // The arguments are
  //   args[0] == <cmake-executable>
  //   args[1] == cmake_link_script
  //   args[2] == <link-script-name>
  //   args[3] == --verbose=?
  bool verbose = false;
  if (args.size() >= 4) {
    if (cmHasLiteralPrefix(args[3], "--verbose=")) {
      if (!cmIsOff(args[3].substr(10))) {
        verbose = true;
      }
    }
  }

  // Read command lines from the script.
  cmsys::ifstream fin(args[2].c_str());
  if (!fin) {
    std::cerr << "Error opening link script \"" << args[2] << "\""
              << std::endl;
    return 1;
  }

  // Run one command at a time.
  std::string command;
  int result = 0;
  while (result == 0 && cmSystemTools::GetLineFromStream(fin, command)) {
    // Skip empty command lines.
    if (command.find_first_not_of(" \t") == std::string::npos) {
      continue;
    }

    // Allocate a process instance.
    cmUVProcessChainBuilder builder;

    // Children should share stdout and stderr with this process.
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);

    // Setup this command line.
    std::vector<std::string> args2;
#ifdef _WIN32
    cmSystemTools::ParseWindowsCommandLine(command.c_str(), args2);
#else
    cmSystemTools::ParseUnixCommandLine(command.c_str(), args2);
#endif
    builder.AddCommand(args2);

    // Report the command if verbose output is enabled.
    if (verbose) {
      std::cout << command << std::endl;
    }

    // Run the command and wait for it to exit.
    auto chain = builder.Start();
    chain.Wait();

    // Report failure if any.
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (status.ExitStatus != 0) {
          result = static_cast<int>(status.ExitStatus);
        }
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        std::cerr << "Error running link command: " << exception.second;
        result = 2;
        break;
      default:
        std::cerr << "Error running link command: " << exception.second;
        result = 1;
        break;
    }
  }

  // Return the final resulting return value.
  return result;
}